

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_padding.cpp
# Opt level: O1

int test_padding(int w,int h,int c,int top,int bottom,int left,int right,int type,float value,
                int per_channel_pad_data_size)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  undefined1 auVar3 [16];
  undefined4 in_EAX;
  int iVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  undefined4 in_register_0000008c;
  ulong uVar8;
  float a_00;
  float extraout_XMM0_Da;
  float a_01;
  float b;
  Option opt;
  Mat a;
  void *ptr_1;
  ulong local_960;
  ulong local_958;
  ulong local_950;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  
  uVar7 = (ulong)(uint)bottom;
  auVar3._12_4_ = -(uint)(w == 0);
  auVar3._0_12_ = ZEXT812(0);
  movmskps(in_EAX,auVar3);
  a_00 = 0.0;
  a.data = (void *)0x0;
  a.refcount._0_4_ = 0;
  a.refcount._4_4_ = 0;
  a.refcount = (int *)0x0;
  a.elemsize = 4;
  a.elempack = 1;
  a.allocator = (Allocator *)0x0;
  a.dims = 3;
  a.w = 5;
  a.h = 7;
  a.cstep = 0x24;
  b = (float)w;
  a.c = w;
  if (w != 0) {
    lVar5 = (long)w * 0x90;
    pd.params[0].type = 0;
    pd.params[0].field_1 = (anon_union_4_2_947300a4_for_anon_struct_72_3_b6d6cd30_1)0x0;
    iVar4 = posix_memalign((void **)&pd,0x10,(long)w * 0x90 + 4);
    if (iVar4 != 0) {
      pd.params[0].type = 0;
      pd.params[0].field_1 = (anon_union_4_2_947300a4_for_anon_struct_72_3_b6d6cd30_1)0x0;
    }
    a.data = (void *)pd.params[0]._0_8_;
    a.refcount = (int *)(pd.params[0]._0_8_ + lVar5);
    *(undefined4 *)(pd.params[0]._0_8_ + lVar5) = 1;
    a_00 = extraout_XMM0_Da;
  }
  Randomize(&a,a_00,b);
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,h);
  ncnn::ParamDict::set(&pd,1,c);
  ncnn::ParamDict::set(&pd,2,top);
  ncnn::ParamDict::set(&pd,3,bottom);
  ncnn::ParamDict::set(&pd,4,left);
  ncnn::ParamDict::set(&pd,5,value);
  ncnn::ParamDict::set(&pd,6,right);
  local_960 = (ulong)(uint)c;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&weights,(ulong)(right != 0),(allocator_type *)&opt);
  uVar8 = (ulong)(uint)top;
  if (right != 0) {
    opt.lightmode = false;
    opt._1_3_ = 0;
    opt.num_threads = 0;
    opt.blob_allocator._0_4_ = 0;
    opt.blob_allocator._4_4_ = 0;
    opt.workspace_allocator = (Allocator *)0x4;
    opt.use_winograd_convolution = true;
    opt.use_sgemm_convolution = false;
    opt.use_int8_inference = false;
    opt.use_vulkan_compute = false;
    opt.use_int8_arithmetic = false;
    opt.use_packing_layout = false;
    opt.use_shader_pack8 = false;
    opt.use_bf16_storage = false;
    opt._36_4_ = 0;
    sVar6 = (size_t)right;
    ptr_1 = (void *)0x0;
    local_958 = (ulong)(uint)top;
    local_950 = uVar7;
    iVar4 = posix_memalign(&ptr_1,0x10,sVar6 * 4 + 4);
    if (iVar4 != 0) {
      ptr_1 = (void *)0x0;
    }
    opt._0_4_ = SUB84(ptr_1,0);
    opt.num_threads = (int)((ulong)ptr_1 >> 0x20);
    opt.blob_allocator = (Allocator *)((long)ptr_1 + sVar6 * 4);
    *(undefined4 *)((long)ptr_1 + sVar6 * 4) = 1;
    Randomize((Mat *)&opt,a_01,b);
    if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != (Mat *)&opt) {
      if (opt.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + 1;
        UNLOCK();
      }
      piVar1 = (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (**(code **)(*(long *)(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->allocator + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])
       ((long)&(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount + 4) = (undefined1  [16])0x0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->data = (void *)0x0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->refcount = (int *)0x0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->dims = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->w = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->h = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->c = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->cstep = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->data = (void *)CONCAT44(opt.num_threads,opt._0_4_);
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->refcount = (int *)opt.blob_allocator;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->elemsize = (size_t)opt.workspace_allocator;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->elempack = CONCAT22(opt._26_2_,opt._24_2_);
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->allocator = (Allocator *)opt._32_8_;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->dims = 1;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->w = right;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->h = 1;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->c = 1;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->cstep = sVar6;
    }
    uVar7 = local_950;
    if (opt.blob_allocator != (Allocator *)0x0) {
      LOCK();
      *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + -1;
      UNLOCK();
      if (*(int *)opt.blob_allocator == 0) {
        if (opt._32_8_ == 0) {
          if ((void *)CONCAT44(opt.num_threads,opt._0_4_) != (void *)0x0) {
            free((void *)CONCAT44(opt.num_threads,opt._0_4_));
          }
        }
        else {
          (**(code **)(*(long *)opt._32_8_ + 0x18))();
        }
      }
    }
    opt.workspace_allocator = (Allocator *)0x0;
    opt.use_winograd_convolution = false;
    opt.use_sgemm_convolution = false;
    opt.use_int8_inference = false;
    opt.use_vulkan_compute = false;
    opt.lightmode = false;
    opt._1_3_ = 0;
    opt.num_threads = 0;
    opt.blob_allocator._0_4_ = 0;
    opt.blob_allocator._4_4_ = 0;
    uVar8 = local_958;
  }
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar4 = test_layer<ncnn::Padding>
                    ("Padding",&pd,&weights,&opt,&a,0.001,(_func_void_Padding_ptr *)0x0);
  if (iVar4 != 0) {
    fprintf(_stderr,
            "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n"
            ,(double)value,5,7,(ulong)(uint)w,(ulong)(uint)h,local_960,uVar8,uVar7,
            CONCAT44(in_register_0000008c,left),(ulong)(uint)right);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  lVar5 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&pd.params[0].v.data + lVar5);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&pd.params[0].type + lVar5);
        plVar2 = *(long **)((long)&pd.params[0].v.elempack + lVar5);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined1 (*) [16])((long)&pd.params[0].v.data + lVar5 + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&pd.params[0].type + lVar5) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&pd.params[0].v.allocator + lVar5) = (undefined1  [16])0x0;
    *(undefined8 *)((long)&pd.params[0].v.h + lVar5) = 0;
    lVar5 = lVar5 + -0x48;
  } while (lVar5 != -0x40);
  if (a.refcount != (int *)0x0) {
    LOCK();
    *a.refcount = *a.refcount + -1;
    UNLOCK();
    if (*a.refcount == 0) {
      if (a.allocator == (Allocator *)0x0) {
        if (a.data != (void *)0x0) {
          free(a.data);
        }
      }
      else {
        (**(code **)(*(long *)a.allocator + 0x18))();
      }
    }
  }
  return iVar4;
}

Assistant:

static int test_padding(int w, int h, int c, int top, int bottom, int left, int right, int type, float value, int per_channel_pad_data_size)
{
    ncnn::Mat a = RandomMat(w, h, c);

    ncnn::ParamDict pd;
    pd.set(0, top);// top
    pd.set(1, bottom);// bottom
    pd.set(2, left);// left
    pd.set(3, right);// right
    pd.set(4, type);// type
    pd.set(5, value);// value
    pd.set(6, per_channel_pad_data_size);// per_channel_pad_data_size

    std::vector<ncnn::Mat> weights(per_channel_pad_data_size ? 1 : 0);
    if (per_channel_pad_data_size)
        weights[0] = RandomMat(per_channel_pad_data_size);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Padding>("Padding", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n", w, h, c, top, bottom, left, right, type, value, per_channel_pad_data_size);
    }

    return ret;
}